

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O2

void Gem_FuncExpand(Gem_Man_t *p,int f,int i)

{
  byte bVar1;
  Gem_Obj_t *pGVar2;
  word **ppwVar3;
  word *pOut;
  word *pOut_00;
  word *pOut_01;
  word *pwVar4;
  word *pwVar5;
  int iVar6;
  int iVar7;
  word *pwVar8;
  int iVar9;
  uint uVar10;
  uint nVars;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  char pCanonPermC [16];
  
  pGVar2 = p->pObjs;
  iVar9 = p->nObjs;
  pwVar8 = Vec_MemReadEntry(p->vTtMem,f);
  if ((int)(*(uint *)(pGVar2 + f) & 0xf) <= i) {
    __assert_fail("i < (int)pObj->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                  ,0xde,"void Gem_FuncExpand(Gem_Man_t *, int, int)");
  }
  iVar6 = p->nVars;
  if (iVar6 < (int)((*(uint *)(pGVar2 + f) & 0xf) + 2)) {
    __assert_fail("(int)pObj->nVars + 2 <= p->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                  ,0xdf,"void Gem_FuncExpand(Gem_Man_t *, int, int)");
  }
  ppwVar3 = p->pTtElems;
  pOut = ppwVar3[iVar6];
  pOut_00 = ppwVar3[(long)iVar6 + 2];
  pOut_01 = ppwVar3[(long)iVar6 + 3];
  Abc_TtCopy(pOut,pwVar8,p->nWords,(int)pOut_01);
  lVar13 = (long)i;
  while( true ) {
    iVar6 = (*(uint *)(pGVar2 + f) & 0xf) - 1;
    iVar7 = (int)lVar13;
    if (iVar6 <= iVar7) break;
    Abc_TtSwapAdjacent(pOut,p->nWords,iVar7);
    lVar13 = lVar13 + 1;
  }
  if (iVar7 != iVar6) {
    __assert_fail("v == (int)pObj->nVars-1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                  ,0xe5,"void Gem_FuncExpand(Gem_Man_t *, int, int)");
  }
  Abc_TtCofactor0p(pOut_00,pOut,p->nWords,iVar7);
  Abc_TtCofactor1p(pOut_01,pOut,p->nWords,iVar7);
  ppwVar3 = p->pTtElems;
  pwVar8 = ppwVar3[lVar13];
  pwVar4 = ppwVar3[lVar13 + 1];
  pwVar5 = ppwVar3[lVar13 + 2];
  uVar10 = p->nWords;
  uVar11 = 0;
  uVar12 = 0;
  if (0 < (int)uVar10) {
    uVar12 = (ulong)uVar10;
  }
  for (; uVar12 != uVar11; uVar11 = uVar11 + 1) {
    pOut[uVar11] = pwVar5[uVar11] & pwVar4[uVar11] |
                   (pwVar5[uVar11] | pwVar4[uVar11]) & pwVar8[uVar11];
  }
  Abc_TtMux(pOut,pOut,pOut_01,pOut_00,uVar10);
  Abc_TtCanonicizePerm(pOut,(*(uint *)(pGVar2 + f) & 0xf) + 2,pCanonPermC);
  uVar10 = 4;
  if (4 < (*(uint *)(pGVar2 + f) & 0xf)) {
    uVar10 = *(uint *)(pGVar2 + f) & 0xf;
  }
  Abc_TtStretch6(pOut,uVar10 + 2,p->nVars);
  iVar6 = Vec_MemHashInsert(p->vTtMem,pOut);
  if (p->nObjs <= iVar6) {
    if (iVar6 != p->nObjs) {
      __assert_fail("iFunc == p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                    ,0xf2,"void Gem_FuncExpand(Gem_Man_t *, int, int)");
    }
    uVar10 = *(uint *)(pGVar2 + iVar9);
    nVars = *(int *)(pGVar2 + f) + 2U & 0xf;
    *(uint *)(pGVar2 + iVar9) = uVar10 & 0xfffffff0 | nVars;
    *(uint *)(pGVar2 + iVar9) = uVar10 & 0xffffff00 | nVars | *(int *)(pGVar2 + f) + 0x10U & 0xf0;
    iVar7 = Gem_GroupsDerive(pOut,nVars,pOut_00,pOut_01);
    bVar1 = *(byte *)(pGVar2 + iVar9);
    pGVar2[iVar9].Predec = f;
    *(uint *)(pGVar2 + iVar9) = (i & 0xffU) << 8 | iVar7 << 0x10 | (uint)bVar1;
    Gem_PrintNode(p,iVar6,"Expand  ",0);
    if (p->nObjsAlloc <= p->nObjs) {
      __assert_fail("p->nObjs < p->nObjsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                    ,0xfa,"void Gem_FuncExpand(Gem_Man_t *, int, int)");
    }
    iVar9 = p->nObjs + 1;
    p->nObjs = iVar9;
    if (iVar9 == p->nObjsAlloc) {
      Gem_ManRealloc(p);
    }
  }
  return;
}

Assistant:

void Gem_FuncExpand( Gem_Man_t * p, int f, int i )
{
    Gem_Obj_t * pNew = p->pObjs + p->nObjs, * pObj = p->pObjs + f; 
    word * pTruth   = Vec_MemReadEntry( p->vTtMem, f );
    word * pResult  = p->pTtElems[p->nVars];
    word * pCofs[2] = { p->pTtElems[p->nVars+2], p->pTtElems[p->nVars+3] };
    int v, iFunc;
    char pCanonPermC[16];
    assert( i < (int)pObj->nVars );
    assert( (int)pObj->nVars + 2 <= p->nVars );
    Abc_TtCopy( pResult, pTruth, p->nWords, 0 );
    // move i variable to the end
    for ( v = i; v < (int)pObj->nVars-1; v++ )
        Abc_TtSwapAdjacent( pResult, p->nWords, v );
    // create new symmetric group
    assert( v == (int)pObj->nVars-1 );
    Abc_TtCofactor0p( pCofs[0], pResult, p->nWords, v );
    Abc_TtCofactor1p( pCofs[1], pResult, p->nWords, v );
    Abc_TtMaj( pResult, p->pTtElems[v], p->pTtElems[v+1], p->pTtElems[v+2], p->nWords );
    Abc_TtMux( pResult, pResult, pCofs[1], pCofs[0], p->nWords );
    // canonicize
    //Extra_PrintHex( stdout, (unsigned*)pResult, pObj->nVars + 2 ); printf("\n");
    Abc_TtCanonicizePerm( pResult, pObj->nVars + 2, pCanonPermC );
    Abc_TtStretch6( pResult, Abc_MaxInt(6, pObj->nVars+2), p->nVars );
    //Extra_PrintHex( stdout, (unsigned*)pResult, pObj->nVars + 2 ); printf("\n\n");
    iFunc = Vec_MemHashInsert( p->vTtMem, pResult );
    if ( iFunc < p->nObjs )
        return;
    assert( iFunc == p->nObjs );
    pNew->nVars   = pObj->nVars + 2;
    pNew->nNodes  = pObj->nNodes + 1;
    pNew->Groups  = Gem_GroupsDerive( pResult, pNew->nVars, pCofs[0], pCofs[1] );
    pNew->Predec  = f;
    pNew->History = i; 
    Gem_PrintNode( p, iFunc, "Expand  ", 0 );

    assert( p->nObjs < p->nObjsAlloc );
    if ( ++p->nObjs == p->nObjsAlloc )
        Gem_ManRealloc( p );
}